

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O2

void __thiscall
RenX_LoggingPlugin::RenX_OnVoteRestartMap
          (RenX_LoggingPlugin *this,Server *server,TeamType *team,PlayerInfo *player)

{
  undefined8 uVar1;
  undefined8 uVar2;
  code *pcVar3;
  undefined1 auVar4 [16];
  string msg;
  undefined8 local_50;
  long local_48;
  
  if ((this->field_0xa8 & 1) == 0) {
    pcVar3 = RenX::Server::sendAdmChan;
  }
  else {
    pcVar3 = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)&local_50,&this->voteRestartMapFmt);
  if (local_48 != 0) {
    RenX::processTags((string *)&local_50,server,player,(PlayerInfo *)0x0,(BuildingInfo *)0x0);
    uVar1 = *(undefined8 *)(RenX::tags + 0xa08);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa10);
    auVar4 = RenX::getTeamColor(*team);
    RenX::replace_tag(&local_50,uVar2,uVar1,auVar4._0_8_,auVar4._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0xa28);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa30);
    auVar4 = RenX::getTeamName(*team);
    RenX::replace_tag(&local_50,uVar2,uVar1,auVar4._0_8_,auVar4._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0xa48);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa50);
    auVar4 = RenX::getFullTeamName(*team);
    RenX::replace_tag(&local_50,uVar2,uVar1,auVar4._0_8_,auVar4._8_8_);
    (*pcVar3)(server,local_48,local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnVoteRestartMap(RenX::Server &server, const RenX::TeamType &team, const RenX::PlayerInfo &player)
{
	logFuncType func;
	if (RenX_LoggingPlugin::voteCallPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->voteRestartMapFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &player);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_COLOR_TAG, RenX::getTeamColor(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_SHORT_TAG, RenX::getTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_LONG_TAG, RenX::getFullTeamName(team));
		(server.*func)(msg);
	}
}